

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_encryptor.cpp
# Opt level: O0

void __thiscall cppcms::sessions::impl::aes_cipher::load(aes_cipher *this)

{
  pointer pcVar1;
  char *__rhs;
  pointer pmVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>
  *in_stack_ffffffffffffff38;
  unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>
  *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *namein;
  
  namein = in_RDI;
  pcVar1 = std::unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>::get
                     (in_stack_ffffffffffffff40);
  if (pcVar1 == (pointer)0x0) {
    crypto::cbc::create(in_stack_ffffffffffffff88);
    std::unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>::operator=
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>::~unique_ptr
              (in_stack_ffffffffffffff40);
    pcVar1 = std::unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>::get
                       (in_stack_ffffffffffffff40);
    if (pcVar1 == (pointer)0x0) {
      __rhs = (char *)__cxa_allocate_exception(0x30);
      std::operator+((char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      std::operator+(in_RDI,__rhs);
      booster::invalid_argument::invalid_argument
                ((invalid_argument *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_RDI);
      __cxa_throw(__rhs,&booster::invalid_argument::typeinfo,
                  booster::invalid_argument::~invalid_argument);
    }
    pcVar1 = std::unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>::
             operator->((unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>
                         *)0x438acc);
    (*pcVar1->_vptr_cbc[4])();
    pcVar1 = std::unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>::
             operator->((unique_ptr<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>
                         *)0x438ae3);
    (*pcVar1->_vptr_cbc[2])(pcVar1,(undefined1 *)((long)&in_RDI[2].field_2 + 8));
  }
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::get((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                  *)in_stack_ffffffffffffff40);
  if (pmVar2 == (pointer)0x0) {
    crypto::message_digest::create_by_name(namein);
    std::
    unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
    ::operator=((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                 *)in_stack_ffffffffffffff40,
                (unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                 *)in_stack_ffffffffffffff38);
    std::
    unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
    ::~unique_ptr((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                   *)in_stack_ffffffffffffff40);
    pmVar2 = std::
             unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ::get((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                    *)in_stack_ffffffffffffff40);
    if (pmVar2 == (pointer)0x0) {
      uVar4 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::operator+((char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      std::operator+(in_RDI,(char *)in_stack_ffffffffffffff40);
      booster::invalid_argument::invalid_argument
                ((invalid_argument *)CONCAT17(uVar4,in_stack_ffffffffffffff50),in_RDI);
      __cxa_throw(uVar3,&booster::invalid_argument::typeinfo,
                  booster::invalid_argument::~invalid_argument);
    }
  }
  return;
}

Assistant:

void aes_cipher::load()
{
	if(!cbc_.get()) {
		cbc_ = crypto::cbc::create(cbc_name_);
		if(!cbc_.get()) {
			throw booster::invalid_argument("cppcms::sessions::aes_cipher: the algorithm " + cbc_name_ + " is not supported,"
							" or the cppcms library was compiled without OpenSSL/GNU-TLS support");
		}
		cbc_->set_nonce_iv();
		cbc_->set_key(cbc_key_);
	}
	if(!digest_.get()) {
		digest_ = crypto::message_digest::create_by_name(md_name_);
		if(!digest_.get()) {
			throw booster::invalid_argument("cppcms::sessions::aes_cipher: the hash algorithm " + cbc_name_ + " is not supported,"
							" or the cppcms library was compiled without OpenSSL/GNU-TLS support");
		}
	}
}